

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynet.cc
# Opt level: O2

VariableIndex __thiscall
dynet::ComputationGraph::add_const_parameters(ComputationGraph *this,Parameter p)

{
  ConstParameterNode *this_00;
  ParameterStorage *pPVar1;
  VariableIndex VVar2;
  VariableIndex new_node_index;
  VariableIndex local_34;
  Parameter local_30;
  ConstParameterNode *local_28;
  
  VVar2 = (VariableIndex)
          ((ulong)((long)(this->nodes).
                         super__Vector_base<dynet::Node_*,_std::allocator<dynet::Node_*>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                  (long)(this->nodes).
                        super__Vector_base<dynet::Node_*,_std::allocator<dynet::Node_*>_>._M_impl.
                        super__Vector_impl_data._M_start) >> 3);
  local_34 = VVar2;
  local_30.p = p.p;
  this_00 = (ConstParameterNode *)operator_new(0x98);
  ConstParameterNode::ConstParameterNode(this_00,&local_30);
  local_28 = this_00;
  std::vector<dynet::Node*,std::allocator<dynet::Node*>>::emplace_back<dynet::Node*>
            ((vector<dynet::Node*,std::allocator<dynet::Node*>> *)this,(Node **)&local_28);
  pPVar1 = Parameter::get_storage(&local_30);
  (this->nodes).super__Vector_base<dynet::Node_*,_std::allocator<dynet::Node_*>_>._M_impl.
  super__Vector_impl_data._M_finish[-1]->device = pPVar1->device;
  set_dim_for_new_node(this,&local_34);
  return VVar2;
}

Assistant:

VariableIndex ComputationGraph::add_const_parameters(Parameter p) {
  VariableIndex new_node_index(nodes.size());
  ConstParameterNode* new_node = new ConstParameterNode(p);
  nodes.push_back(new_node);
  nodes.back()->device = p.get_storage().device;
  set_dim_for_new_node(new_node_index);
  return new_node_index;
}